

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

Maybe<unsigned_long_long> __thiscall
kj::anon_unknown_55::tryParseInteger<unsigned_long_long>(anon_unknown_55 *this,StringPtr *s)

{
  unsigned_long_long max_00;
  Maybe<unsigned_long_long> MVar1;
  unsigned_long_long max;
  StringPtr *s_local;
  
  max_00 = MaxValue_::operator_cast_to_unsigned_long_long((MaxValue_ *)&kj::maxValue);
  MVar1 = tryParseUnsigned(this,s,max_00);
  MVar1.ptr._0_8_ = this;
  return (Maybe<unsigned_long_long>)MVar1.ptr;
}

Assistant:

Maybe<T> tryParseInteger(const StringPtr& s) {
  if (static_cast<T>(minValue) < 0) {
    long long min = static_cast<T>(minValue);
    long long max = static_cast<T>(maxValue);
    return static_cast<Maybe<T>>(tryParseSigned(s, min, max));
  } else {
    unsigned long long max = static_cast<T>(maxValue);
    return static_cast<Maybe<T>>(tryParseUnsigned(s, max));
  }
}